

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser.hpp
# Opt level: O2

vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
* __thiscall
bioparser::MhapParser<bioparser::test::MhapOverlap>::Parse
          (vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
           *__return_storage_ptr__,MhapParser<bioparser::test::MhapOverlap> *this,uint64_t bytes,
          bool param_2)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint64_t parsed_bytes;
  uint32_t rhs_len;
  uint32_t rhs_end;
  uint32_t rhs_begin;
  uint32_t rhs_strand;
  uint32_t lhs_len;
  uint32_t lhs_end;
  uint32_t lhs_begin;
  uint32_t lhs_strand;
  uint32_t num_minmers;
  double error;
  uint64_t rhs_id;
  uint64_t lhs_id;
  anon_class_120_15_e6070a55 create_T;
  uint64_t local_f0;
  uint32_t local_e4 [9];
  double local_c0;
  uint64_t local_b8 [2];
  anon_class_120_15_e6070a55 local_a8;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.lhs_id = local_b8 + 1;
  local_b8[1] = 0;
  local_a8.rhs_id = local_b8;
  local_b8[0] = 0;
  local_a8.error = &local_c0;
  local_c0 = 0.0;
  local_a8.num_minmers = local_e4 + 8;
  local_e4[8] = 0;
  local_a8.lhs_strand = local_e4 + 7;
  local_e4[7] = 0;
  local_a8.lhs_begin = local_e4 + 6;
  local_e4[6] = 0;
  local_a8.lhs_end = local_e4 + 5;
  local_e4[5] = 0;
  local_a8.lhs_len = local_e4 + 4;
  local_e4[4] = 0;
  local_a8.rhs_strand = local_e4 + 3;
  local_e4[3] = 0;
  local_a8.rhs_begin = local_e4 + 2;
  local_e4[2] = 0;
  local_a8.rhs_end = local_e4 + 1;
  local_e4[1] = 0;
  local_a8.rhs_len = local_e4;
  local_e4[0] = 0;
  local_a8.parsed_bytes = &local_f0;
  local_f0 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = false;
  local_a8.this = this;
  local_a8.dst = __return_storage_ptr__;
  while( true ) {
    for (uVar4 = (ulong)(this->super_Parser<bioparser::test::MhapOverlap>).buffer_ptr_;
        uVar3 = (uint)uVar4,
        uVar4 < (this->super_Parser<bioparser::test::MhapOverlap>).buffer_bytes_; uVar4 = uVar4 + 1)
    {
      if ((this->super_Parser<bioparser::test::MhapOverlap>).buffer_.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
          [uVar4] == '\n') {
        Parser<bioparser::test::MhapOverlap>::Store
                  (&this->super_Parser<bioparser::test::MhapOverlap>,
                   (ulong)(uVar3 - (this->super_Parser<bioparser::test::MhapOverlap>).buffer_ptr_),
                   false);
        Parse::anon_class_120_15_e6070a55::operator()(&local_a8);
        if (bytes <= local_f0) {
          return __return_storage_ptr__;
        }
      }
    }
    uVar1 = (this->super_Parser<bioparser::test::MhapOverlap>).buffer_ptr_;
    if (uVar1 < uVar3) {
      Parser<bioparser::test::MhapOverlap>::Store
                (&this->super_Parser<bioparser::test::MhapOverlap>,(ulong)(uVar3 - uVar1),false);
    }
    if (bVar2 != false) break;
    bVar2 = Parser<bioparser::test::MhapOverlap>::Read
                      (&this->super_Parser<bioparser::test::MhapOverlap>);
  }
  if ((this->super_Parser<bioparser::test::MhapOverlap>).storage_ptr_ != 0) {
    Parse::anon_class_120_15_e6070a55::operator()(&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<T>> Parse(
      std::uint64_t bytes, bool = true) override {
    std::vector<std::unique_ptr<T>> dst;
    std::uint64_t parsed_bytes = 0;

    std::uint64_t lhs_id = 0;
    std::uint64_t rhs_id = 0;
    double error = 0;
    std::uint32_t num_minmers = 0;
    std::uint32_t lhs_strand = 0;
    std::uint32_t lhs_begin = 0;
    std::uint32_t lhs_end = 0;
    std::uint32_t lhs_len = 0;
    std::uint32_t rhs_strand = 0;
    std::uint32_t rhs_begin = 0;
    std::uint32_t rhs_end = 0;
    std::uint32_t rhs_len = 0;

    auto create_T = [&] () -> void {
      auto storage_ptr = this->RightStrip(
          this->storage().data(),
          this->storage_ptr());
      this->Terminate(storage_ptr);

      std::uint32_t num_values = 0;
      std::uint32_t begin_ptr = 0;
      while (true) {
        auto end_ptr = begin_ptr;
        while (end_ptr < storage_ptr && this->storage()[end_ptr] != ' ') {
          ++end_ptr;
        }
        this->Terminate(end_ptr);

        switch (num_values) {
          case 0: lhs_id = std::atoll(this->storage().data() + begin_ptr); break;  // NOLINT
          case 1: rhs_id = std::atoll(this->storage().data() + begin_ptr); break;  // NOLINT
          case 2: error = std::atof(this->storage().data() + begin_ptr); break;
          case 3: num_minmers = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 4: lhs_strand = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 5: lhs_begin = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 6: lhs_end = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 7: lhs_len = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 8: rhs_strand = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 9: rhs_begin = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 10: rhs_end = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 11: rhs_len = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          default: break;
        }

        ++num_values;
        if (end_ptr == storage_ptr || num_values == 12) {
          break;
        }
        begin_ptr = end_ptr + 1;
      }

      if (num_values != 12) {
        throw std::invalid_argument(
            "[bioparser::MhapParser] error: invalid file format");
      }

      dst.emplace_back(std::unique_ptr<T>(new T(
          lhs_id, rhs_id,
          error,
          num_minmers,
          lhs_strand, lhs_begin, lhs_end, lhs_len,
          rhs_strand, rhs_begin, rhs_end, rhs_len)));

      parsed_bytes += this->storage_ptr();
      this->Clear();
    };

    bool is_eof = false;

    while (true) {
      auto buffer_ptr = this->buffer_ptr();
      for (; buffer_ptr < this->buffer_bytes(); ++buffer_ptr) {
        auto c = this->buffer()[buffer_ptr];
        if (c == '\n') {
          this->Store(buffer_ptr - this->buffer_ptr());
          create_T();
          if (parsed_bytes >= bytes) {
            return dst;
          }
        }
      }
      if (this->buffer_ptr() < buffer_ptr) {
        this->Store(buffer_ptr - this->buffer_ptr());
      }

      if (is_eof) {
        break;
      }
      is_eof = this->Read();
    }

    if (this->storage_ptr() != 0) {
      create_T();
    }

    return dst;
  }